

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idw.cc
# Opt level: O0

void __thiscall gmath::IDW::add(IDW *this,uint x,uint y,float f,float w)

{
  IDWNode *pIVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_stack_00000010;
  float in_stack_00000014;
  uint in_stack_00000018;
  uint in_stack_0000001c;
  IDWNode *in_stack_00000020;
  Lock lock;
  Semaphore *in_stack_ffffffffffffffb8;
  Lock *in_stack_ffffffffffffffc0;
  
  gutil::Lock::Lock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(in_RDI + 0x10) == 0) {
    pIVar1 = (IDWNode *)operator_new(0x48);
    IDWNode::IDWNode(pIVar1,in_ESI,in_EDX,in_XMM0_Da,in_XMM1_Da);
    *(IDWNode **)(in_RDI + 0x10) = pIVar1;
  }
  else {
    pIVar1 = IDWNode::add(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000014,
                          in_stack_00000010);
    *(IDWNode **)(in_RDI + 0x10) = pIVar1;
  }
  gutil::Lock::~Lock((Lock *)0x13e427);
  return;
}

Assistant:

void IDW::add(unsigned int x, unsigned int y, float f, float w)
{
  gutil::Lock lock(sem);

  if (root == 0)
  {
    root=new IDWNode(x, y, f, w);
  }
  else
  {
    root=root->add(x, y, f, w);
  }
}